

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

GLPipelineObj * __thiscall
Diligent::PipelineStateGLImpl::GetGLProgramPipeline
          (PipelineStateGLImpl *this,NativeGLContextType Context)

{
  SpinLock *this_00;
  GLuint GVar1;
  byte bVar2;
  SHADER_TYPE SVar3;
  ulong uVar4;
  long lVar5;
  pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>
  *ctx_pipeline;
  pointer ppVar6;
  GLPipelineObj *this_01;
  GLenum err;
  string msg;
  uint local_5c;
  NativeGLContextType local_58;
  string local_50;
  
  this_00 = &this->m_ProgPipelineLock;
  LOCK();
  bVar2 = (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i;
  (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  local_58 = Context;
  while ((bVar2 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar2 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  ppVar6 = (this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar6 == (this->m_GLProgPipelines).
                  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_50._M_dataplus._M_p._0_1_ = 1;
      std::
      vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
      ::emplace_back<__GLXcontextRec*&,bool>
                ((vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
                  *)&this->m_GLProgPipelines,&local_58,(bool *)&local_50);
      ppVar6 = (this->m_GLProgPipelines).
               super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this->m_NumPrograms != '\0') {
        GVar1 = ppVar6[-1].second.m_uiHandle;
        lVar5 = 0;
        uVar4 = 0;
        do {
          SVar3 = GetShaderStageType(this,(Uint32)uVar4);
          if ((SHADER_TYPE_COMPUTE < SVar3) || ((0x100010116U >> ((ulong)SVar3 & 0x3f) & 1) == 0)) {
            SVar3 = SHADER_TYPE_UNKNOWN;
          }
          (*__glewUseProgramStages)
                    (GVar1,SVar3,
                     **(GLuint **)
                       ((long)&(this->m_GLPrograms->
                               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar5));
          local_5c = glGetError();
          if (local_5c != 0) {
            LogError<false,char[28],char[17],unsigned_int>
                      (false,"GetGLProgramPipeline",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                       ,0x287,(char (*) [28])"glUseProgramStages() failed",
                       (char (*) [17])"\nGL Error Code: ",&local_5c);
            FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
            DebugAssertionFailed
                      ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                        local_50._M_dataplus._M_p._0_1_),"GetGLProgramPipeline",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                       ,0x287);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
                &local_50.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       local_50._M_dataplus._M_p._0_1_),
                              local_50.field_2._M_allocated_capacity + 1);
            }
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 < this->m_NumPrograms);
      }
      this_01 = &ppVar6[-1].second;
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::SetName
                (this_01,(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         .m_Desc.super_DeviceObjectAttribs.Name);
LAB_0017c3b8:
      Threading::SpinLock::unlock(this_00);
      return this_01;
    }
    if (ppVar6->first == local_58) {
      this_01 = &ppVar6->second;
      goto LAB_0017c3b8;
    }
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

GLObjectWrappers::GLPipelineObj& PipelineStateGLImpl::GetGLProgramPipeline(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard Guard{m_ProgPipelineLock};
    for (auto& ctx_pipeline : m_GLProgPipelines)
    {
        if (ctx_pipeline.first == Context)
            return ctx_pipeline.second;
    }

    // Create new program pipeline
    m_GLProgPipelines.emplace_back(Context, true);
    auto&  ctx_pipeline = m_GLProgPipelines.back();
    GLuint Pipeline     = ctx_pipeline.second;
    for (Uint32 i = 0; i < GetNumShaderStages(); ++i)
    {
        auto GLShaderBit = ShaderTypeToGLShaderBit(GetShaderStageType(i));
        // If the program has an active code for each stage mentioned in set flags,
        // then that code will be used by the pipeline. If program is 0, then the given
        // stages are cleared from the pipeline.
        glUseProgramStages(Pipeline, GLShaderBit, m_GLPrograms[i]->GetGLHandle());
        DEV_CHECK_GL_ERROR("glUseProgramStages() failed");
    }

    ctx_pipeline.second.SetName(m_Desc.Name);

    return ctx_pipeline.second;
}